

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 CalcWindowSizeAfterConstraint(ImGuiWindow *window,ImVec2 *size_desired)

{
  float fVar1;
  ImGuiSizeCallback p_Var2;
  ImGuiContext *pIVar3;
  ImGuiContext *g;
  ImGuiWindow *window_for_height;
  float fVar4;
  float fVar5;
  ImVec2 IVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ImGuiSizeCallbackData local_40;
  
  pIVar3 = GImGui;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = size_desired;
  if (((GImGui->NextWindowData).Flags & 0x10) != 0) {
    fVar4 = (GImGui->NextWindowData).SizeConstraintRect.Min.x;
    fVar5 = (GImGui->NextWindowData).SizeConstraintRect.Min.y;
    if ((fVar4 < 0.0) || (fVar1 = (GImGui->NextWindowData).SizeConstraintRect.Max.x, fVar1 < 0.0)) {
      auVar10 = ZEXT416((uint)(window->SizeFull).x);
    }
    else {
      auVar7 = vminss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)size_desired));
      auVar10 = vcmpss_avx(ZEXT416((uint)size_desired),ZEXT416((uint)fVar4),1);
      auVar10 = vblendvps_avx(auVar7,ZEXT416((uint)fVar4),auVar10);
    }
    if ((fVar5 < 0.0) || (fVar4 = (GImGui->NextWindowData).SizeConstraintRect.Max.y, fVar4 < 0.0)) {
      auVar7 = ZEXT416((uint)(window->SizeFull).y);
    }
    else {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = size_desired;
      auVar7 = vmovshdup_avx(auVar7);
      auVar8 = vminss_avx(ZEXT416((uint)fVar4),auVar7);
      auVar7 = vcmpss_avx(auVar7,ZEXT416((uint)fVar5),1);
      auVar7 = vblendvps_avx(auVar8,ZEXT416((uint)fVar5),auVar7);
    }
    auVar8 = vinsertps_avx(auVar10,auVar7,0x10);
    p_Var2 = (GImGui->NextWindowData).SizeCallback;
    if (p_Var2 != (ImGuiSizeCallback)0x0) {
      local_40.UserData = (GImGui->NextWindowData).SizeCallbackUserData;
      local_40.Pos = window->Pos;
      local_40.CurrentSize = window->SizeFull;
      local_40.DesiredSize = (ImVec2)vmovlps_avx(auVar8);
      (*p_Var2)(&local_40);
      auVar8._8_8_ = 0;
      auVar8._0_4_ = local_40.DesiredSize.x;
      auVar8._4_4_ = local_40.DesiredSize.y;
    }
    auVar9._0_4_ = (int)auVar8._0_4_;
    auVar9._4_4_ = (int)auVar8._4_4_;
    auVar9._8_4_ = (int)auVar8._8_4_;
    auVar9._12_4_ = (int)auVar8._12_4_;
    auVar10 = vcvtdq2ps_avx(auVar9);
  }
  IVar6 = auVar10._0_8_;
  if ((window->Flags & 0x1000040U) == 0) {
    auVar8 = vmovshdup_avx(auVar10);
    auVar9 = ZEXT416((uint)(pIVar3->Style).WindowMinSize.x);
    auVar7 = vcmpss_avx(auVar9,auVar10,2);
    auVar10 = vblendvps_avx(auVar9,auVar10,auVar7);
    auVar9 = ZEXT416((uint)(pIVar3->Style).WindowMinSize.y);
    auVar7 = vcmpss_avx(auVar9,auVar8,2);
    auVar7 = vblendvps_avx(auVar9,auVar8,auVar7);
    fVar4 = 0.0;
    if ((window->Flags & 1U) == 0) {
      fVar4 = GImGui->FontBaseSize * window->FontWindowScale;
      if (window->ParentWindow != (ImGuiWindow *)0x0) {
        fVar4 = fVar4 * window->ParentWindow->FontWindowScale;
      }
      fVar5 = (GImGui->Style).FramePadding.y;
      fVar4 = fVar5 + fVar5 + fVar4;
    }
    fVar5 = ImGuiWindow::MenuBarHeight(window);
    auVar9 = ZEXT416((uint)((pIVar3->Style).WindowRounding + -1.0));
    auVar8 = vcmpss_avx(auVar9,ZEXT416(0),2);
    auVar8 = vandnps_avx(auVar8,auVar9);
    auVar9 = ZEXT416((uint)(fVar5 + fVar4 + auVar8._0_4_));
    auVar8 = vcmpss_avx(auVar9,auVar7,2);
    auVar7 = vblendvps_avx(auVar9,auVar7,auVar8);
    auVar10 = vinsertps_avx(auVar10,auVar7,0x10);
    IVar6 = auVar10._0_8_;
  }
  return IVar6;
}

Assistant:

static ImVec2 CalcWindowSizeAfterConstraint(ImGuiWindow* window, const ImVec2& size_desired)
{
    ImGuiContext& g = *GImGui;
    ImVec2 new_size = size_desired;
    if (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint)
    {
        // Using -1,-1 on either X/Y axis to preserve the current size.
        ImRect cr = g.NextWindowData.SizeConstraintRect;
        new_size.x = (cr.Min.x >= 0 && cr.Max.x >= 0) ? ImClamp(new_size.x, cr.Min.x, cr.Max.x) : window->SizeFull.x;
        new_size.y = (cr.Min.y >= 0 && cr.Max.y >= 0) ? ImClamp(new_size.y, cr.Min.y, cr.Max.y) : window->SizeFull.y;
        if (g.NextWindowData.SizeCallback)
        {
            ImGuiSizeCallbackData data;
            data.UserData = g.NextWindowData.SizeCallbackUserData;
            data.Pos = window->Pos;
            data.CurrentSize = window->SizeFull;
            data.DesiredSize = new_size;
            g.NextWindowData.SizeCallback(&data);
            new_size = data.DesiredSize;
        }
        new_size.x = IM_FLOOR(new_size.x);
        new_size.y = IM_FLOOR(new_size.y);
    }

    // Minimum size
    if (!(window->Flags & (ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_AlwaysAutoResize)))
    {
        ImGuiWindow* window_for_height = window;
        new_size = ImMax(new_size, g.Style.WindowMinSize);
        new_size.y = ImMax(new_size.y, window_for_height->TitleBarHeight() + window_for_height->MenuBarHeight() + ImMax(0.0f, g.Style.WindowRounding - 1.0f)); // Reduce artifacts with very small windows
    }
    return new_size;
}